

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O0

int SSL_CTX_set_compliance_policy(SSL_CTX *ctx,ssl_compliance_policy_t policy)

{
  ssl_compliance_policy_t policy_local;
  SSL_CTX *ctx_local;
  
  if (policy == ssl_compliance_policy_fips_202205) {
    ctx_local._4_4_ = fips202205::Configure(ctx);
  }
  else if (policy == ssl_compliance_policy_wpa3_192_202304) {
    ctx_local._4_4_ = wpa202304::Configure(ctx);
  }
  else if (policy == ssl_compliance_policy_cnsa_202407) {
    ctx_local._4_4_ = cnsa202407::Configure(ctx);
  }
  else {
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

int SSL_CTX_set_compliance_policy(SSL_CTX *ctx,
                                  enum ssl_compliance_policy_t policy) {
  switch (policy) {
    case ssl_compliance_policy_fips_202205:
      return fips202205::Configure(ctx);
    case ssl_compliance_policy_wpa3_192_202304:
      return wpa202304::Configure(ctx);
    case ssl_compliance_policy_cnsa_202407:
      return cnsa202407::Configure(ctx);
    default:
      return 0;
  }
}